

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

int Curl_parsenetrc(char *host,char *login,char *password,char *netrcfile)

{
  __uid_t __uid;
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char local_178 [4];
  int netrcbuffsize;
  char netrcbuffer [256];
  _Bool done;
  char *tok_buf;
  char *tok;
  passwd *pw;
  int state_our_login;
  char state_password;
  char state_login;
  host_lookup_state state;
  _Bool netrc_alloc;
  _Bool home_alloc;
  char *home;
  int specific_login;
  int retcode;
  FILE *file;
  char *netrcfile_local;
  char *password_local;
  char *login_local;
  char *host_local;
  
  home._4_4_ = 1;
  home._0_4_ = (uint)(*login != '\0');
  _state = (char *)0x0;
  state_login = '\0';
  state_password = '\0';
  state_our_login = 0;
  pw._7_1_ = '\0';
  pw._6_1_ = '\0';
  pw._0_4_ = 0;
  file = (FILE *)netrcfile;
  netrcfile_local = password;
  password_local = login;
  login_local = host;
  if (netrcfile == (char *)0x0) {
    _state = curl_getenv("HOME");
    if (_state == (char *)0x0) {
      __uid = geteuid();
      tok = (char *)getpwuid(__uid);
      if ((passwd *)tok != (passwd *)0x0) {
        _state = ((passwd *)tok)->pw_dir;
      }
    }
    else {
      state_login = '\x01';
    }
    if (_state == (char *)0x0) {
      return -1;
    }
    file = (FILE *)curl_maprintf("%s%s%s",_state,"/",".netrc");
    if (file == (FILE *)0x0) {
      if ((state_login & 1U) != 0) {
        (*Curl_cfree)(_state);
      }
      return -1;
    }
    state_password = '\x01';
  }
  _specific_login = fopen64((char *)file,"r");
  if (_specific_login != (FILE *)0x0) {
    netrcbuffer[0xff] = '\0';
LAB_0013582b:
    bVar3 = false;
    if ((netrcbuffer[0xff] & 1U) == 0) {
      pcVar2 = fgets(local_178,0x100,_specific_login);
      bVar3 = pcVar2 != (char *)0x0;
    }
    if (bVar3) {
      tok_buf = strtok_r(local_178," \t\n",(char **)&stack0xffffffffffffff90);
      while ((netrcbuffer[0xff] & 1U) == 0 && tok_buf != (char *)0x0) {
        if ((*password_local != '\0') && (*netrcfile_local != '\0')) {
          netrcbuffer[0xff] = '\x01';
          break;
        }
        if (state_our_login == 0) {
          iVar1 = Curl_raw_equal("machine",tok_buf);
          if (iVar1 != 0) {
            state_our_login = 1;
          }
        }
        else if (state_our_login == 1) {
          iVar1 = Curl_raw_equal(login_local,tok_buf);
          if (iVar1 == 0) {
            state_our_login = 0;
          }
          else {
            state_our_login = 2;
            home._4_4_ = 0;
          }
        }
        else if (state_our_login == 2) {
          if (pw._7_1_ == '\0') {
            if (pw._6_1_ == '\0') {
              iVar1 = Curl_raw_equal("login",tok_buf);
              if (iVar1 == 0) {
                iVar1 = Curl_raw_equal("password",tok_buf);
                if (iVar1 == 0) {
                  iVar1 = Curl_raw_equal("machine",tok_buf);
                  if (iVar1 != 0) {
                    state_our_login = 1;
                    pw._0_4_ = 0;
                  }
                }
                else {
                  pw._6_1_ = '\x01';
                }
              }
              else {
                pw._7_1_ = '\x01';
              }
            }
            else {
              if (((int)pw != 0) || ((uint)home == 0)) {
                strncpy(netrcfile_local,tok_buf,0x3f);
              }
              pw._6_1_ = '\0';
            }
          }
          else {
            if ((uint)home == 0) {
              strncpy(password_local,tok_buf,0x3f);
            }
            else {
              pw._0_4_ = Curl_raw_equal(password_local,tok_buf);
            }
            pw._7_1_ = '\0';
          }
        }
        tok_buf = strtok_r((char *)0x0," \t\n",(char **)&stack0xffffffffffffff90);
      }
      goto LAB_0013582b;
    }
    fclose(_specific_login);
  }
  if ((state_login & 1U) != 0) {
    (*Curl_cfree)(_state);
  }
  if ((state_password & 1U) != 0) {
    (*Curl_cfree)(file);
  }
  return home._4_4_;
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char *login,
                    char *password,
                    char *netrcfile)
{
  FILE *file;
  int retcode=1;
  int specific_login = (login[0] != 0);
  char *home = NULL;
  bool home_alloc = FALSE;
  bool netrc_alloc = FALSE;
  enum host_lookup_state state=NOTHING;

  char state_login=0;      /* Found a login keyword */
  char state_password=0;   /* Found a password keyword */
  int state_our_login=FALSE;  /* With specific_login, found *our* login name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw= getpwuid(geteuid());
      if(pw) {
#ifdef __VMS
        home = decc_translate_vms(pw->pw_dir);
#else
        home = pw->pw_dir;
#endif
      }
#endif
    }

    if(!home)
      return -1;

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(!netrcfile) {
      if(home_alloc)
        free(home);
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, "r");
  if(file) {
    char *tok;
    char *tok_buf;
    bool done=FALSE;
    char netrcbuffer[256];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok=strtok_r(netrcbuffer, " \t\n", &tok_buf);
      while(!done && tok) {

        if(login[0] && password[0]) {
          done=TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(Curl_raw_equal("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state=HOSTFOUND;
          }
          break;
        case HOSTFOUND:
          if(Curl_raw_equal(host, tok)) {
            /* and yes, this is our host! */
            state=HOSTVALID;
            retcode=0; /* we did find our host */
          }
          else
            /* not our host */
            state=NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = Curl_raw_equal(login, tok);
            }
            else {
              strncpy(login, tok, LOGINSIZE-1);
            }
            state_login=0;
          }
          else if(state_password) {
            if(state_our_login || !specific_login) {
              strncpy(password, tok, PASSWORDSIZE-1);
            }
            state_password=0;
          }
          else if(Curl_raw_equal("login", tok))
            state_login=1;
          else if(Curl_raw_equal("password", tok))
            state_password=1;
          else if(Curl_raw_equal("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    fclose(file);
  }

  if(home_alloc)
    free(home);
  if(netrc_alloc)
    free(netrcfile);

  return retcode;
}